

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_CreateIntArray(int *numbers,int count)

{
  int iVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  ulong uVar4;
  cJSON *pcVar5;
  bool bVar6;
  
  pcVar2 = (cJSON *)(*cJSON_malloc)(0x40);
  if (pcVar2 != (cJSON *)0x0) {
    pcVar2->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar2->type = 0;
    pcVar2->valuedouble = 0.0;
    pcVar2->string = (char *)0x0;
    pcVar2->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar2->valueint = 0;
    pcVar2->next = (cJSON *)0x0;
    pcVar2->prev = (cJSON *)0x0;
    pcVar2->type = 5;
  }
  if (0 < count && pcVar2 != (cJSON *)0x0) {
    uVar4 = 1;
    pcVar5 = (cJSON *)0x0;
    do {
      iVar1 = numbers[uVar4 - 1];
      pcVar3 = (cJSON *)(*cJSON_malloc)(0x40);
      if (pcVar3 != (cJSON *)0x0) {
        pcVar3->child = (cJSON *)0x0;
        *(undefined8 *)&pcVar3->type = 0;
        pcVar3->valuedouble = 0.0;
        pcVar3->string = (char *)0x0;
        pcVar3->valuestring = (char *)0x0;
        *(undefined8 *)&pcVar3->valueint = 0;
        pcVar3->next = (cJSON *)0x0;
        pcVar3->prev = (cJSON *)0x0;
        pcVar3->type = 3;
        pcVar3->valuedouble = (double)iVar1;
        pcVar3->valueint = iVar1;
      }
      if (uVar4 == 1) {
        pcVar2->child = pcVar3;
      }
      else {
        pcVar5->next = pcVar3;
        pcVar3->prev = pcVar5;
      }
    } while ((pcVar2 != (cJSON *)0x0) &&
            (bVar6 = uVar4 < (uint)count, uVar4 = uVar4 + 1, pcVar5 = pcVar3, bVar6));
  }
  return pcVar2;
}

Assistant:

cJSON *cJSON_CreateIntArray(const int *numbers,int count)		{int i;cJSON *n=0,*p=0,*a=cJSON_CreateArray();for(i=0;a && i<count;i++){n=cJSON_CreateNumber(numbers[i]);if(!i)a->child=n;else suffix_object(p,n);p=n;}return a;}